

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strerror_s.c
# Opt level: O0

errno_t strerror_s(char *s,rsize_t maxsize,errno_t errnum)

{
  size_t sVar1;
  char *pcVar2;
  size_t len;
  errno_t errnum_local;
  rsize_t maxsize_local;
  char *s_local;
  
  sVar1 = strerrorlen_s(errnum);
  if (((s == (char *)0x0) || (0x7fffffffffffffff < maxsize)) || (maxsize == 0)) {
    (*_PDCLIB_constraint_handler)(_PDCLIB_lc_messages->errno_texts[0x16],(void *)0x0,0x16);
    s_local._4_4_ = 0x16;
  }
  else {
    if (sVar1 < maxsize) {
      pcVar2 = strerror(errnum);
      strcpy(s,pcVar2);
    }
    else {
      pcVar2 = strerror(errnum);
      strncpy(s,pcVar2,maxsize - 1);
      if (maxsize < 4) {
        s[maxsize - 1] = '\0';
      }
      else {
        strcpy(s + (maxsize - 4),"...");
      }
    }
    s_local._4_4_ = 0;
  }
  return s_local._4_4_;
}

Assistant:

errno_t strerror_s( char * s, rsize_t maxsize, errno_t errnum )
{
    size_t len = strerrorlen_s( errnum );

    if ( s == NULL || maxsize > RSIZE_MAX || maxsize == 0 )
    {
        _PDCLIB_constraint_handler( _PDCLIB_CONSTRAINT_VIOLATION( _PDCLIB_EINVAL ) );
        return _PDCLIB_EINVAL;
    }

    if ( len < maxsize )
    {
        strcpy( s, strerror( errnum ) );
    }
    else
    {
        strncpy( s, strerror( errnum ), maxsize - 1 );

        if ( maxsize > 3 )
        {
            strcpy( &s[ maxsize - 4 ], "..." );
        }
        else
        {
            s[ maxsize - 1 ] = '\0';
        }
    }

    return 0;
}